

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::ExtractSubrange
          (RepeatedField<int> *this,int start,int num,int *elements)

{
  int iVar1;
  LogMessage *pLVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  LogMessage local_80;
  ulong local_48;
  ulong local_40;
  int local_38;
  LogFinisher local_31;
  
  uVar6 = (ulong)(uint)num;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x563);
    pLVar2 = internal::LogMessage::operator<<(&local_80,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar2);
    internal::LogMessage::~LogMessage(&local_80);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x564);
    pLVar2 = internal::LogMessage::operator<<(&local_80,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar2);
    internal::LogMessage::~LogMessage(&local_80);
  }
  local_38 = num + start;
  if (this->current_size_ < local_38) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x565);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_80,"CHECK failed: (start + num) <= (this->current_size_): ");
    internal::LogFinisher::operator=(&local_31,pLVar2);
    internal::LogMessage::~LogMessage(&local_80);
  }
  local_40 = uVar6;
  if (0 < num && elements != (int *)0x0) {
    uVar7 = 0;
    local_48 = uVar6;
    do {
      piVar3 = Get(this,start + (int)uVar7);
      elements[uVar7] = *piVar3;
      uVar7 = uVar7 + 1;
    } while (local_48 != uVar7);
  }
  iVar5 = (int)local_40;
  if (0 < iVar5) {
    iVar1 = this->current_size_;
    if (local_38 < iVar1) {
      do {
        piVar3 = Get(this,iVar5 + start);
        Set(this,start,piVar3);
        iVar1 = this->current_size_;
        iVar4 = iVar5 + start;
        start = start + 1;
      } while (iVar4 + 1 < iVar1);
    }
    if (0 < iVar1) {
      this->current_size_ = iVar1 - iVar5;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != NULL) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}